

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O2

void int_rel(IntVar *x,IntRelType t,IntVar *y,int c)

{
  uint uVar1;
  IntView<0> y_00;
  IntView<0> y_01;
  IntView<0> x_00;
  IntView<0> x_01;
  int local_5c;
  vec<IntVar_*> local_58;
  vec<int> local_48;
  IntVar *y_local;
  IntVar *x_local;
  ulong uVar2;
  IntVar *pIVar3;
  IntVar *pIVar4;
  
  y_local = y;
  x_local = x;
  if (IRT_GT < t) {
    fprintf(_stderr,"%s:%d: ","binary.cpp",0x132);
    fwrite("Assertion failed.\n",0x12,1,_stderr);
    abort();
  }
  uVar2 = (ulong)(uint)c;
  pIVar3 = y;
  pIVar4 = x;
  switch((ulong)t) {
  case 0:
    int_rel(x,IRT_LE,y,c);
    int_rel(x,IRT_GE,y,c);
    goto LAB_0018ee4c;
  case 1:
    y_00._8_8_ = (uVar2 << 0x20) + 1;
    y_00.var = y;
    x_00.a = 1;
    x_00.b = 0;
    x_00.var = x;
    newBinNE(x_00,y_00,&bv_true);
    goto LAB_0018ee4c;
  case 2:
    uVar1 = -c;
    goto LAB_0018edf3;
  case 3:
    uVar1 = 1 - c;
LAB_0018edf3:
    uVar2 = (ulong)uVar1;
    pIVar3 = x;
    pIVar4 = y;
    break;
  case 4:
    break;
  case 5:
    uVar2 = (ulong)(c + 1);
  }
  y_01._8_8_ = (uVar2 << 0x20) + 1;
  y_01.var = pIVar3;
  x_01.a = 1;
  x_01.b = 0;
  x_01.var = pIVar4;
  newBinGE(x_01,y_01,&bv_true);
LAB_0018ee4c:
  local_48.sz = 0;
  local_48.cap = 0;
  local_48.data = (int *)0x0;
  local_58.sz = 0;
  local_58.cap = 0;
  local_58.data = (IntVar **)0x0;
  local_5c = 1;
  vec<int>::push(&local_48,&local_5c);
  local_5c = -1;
  vec<int>::push(&local_48,&local_5c);
  vec<IntVar_*>::push(&local_58,&x_local);
  vec<IntVar_*>::push(&local_58,&y_local);
  (*(code *)(&DAT_001b0c40 + *(int *)(&DAT_001b0c40 + (ulong)t * 4)))();
  return;
}

Assistant:

void int_rel(IntVar* x, IntRelType t, IntVar* y, int c) {
	switch (t) {
		case IRT_EQ:
			int_rel(x, IRT_LE, y, c);
			int_rel(x, IRT_GE, y, c);
			break;
		case IRT_NE:
			newBinNE(IntView<>(x), IntView<>(y, 1, c));
			break;
		case IRT_LE:
			// a <= b <=> b >= a
			newBinGE(IntView<>(y), IntView<>(x, 1, -c));
			break;
		case IRT_LT:
			// a < b <=> b >= (a+1)
			newBinGE(IntView<>(y), IntView<>(x, 1, 1 - c));
			break;
		case IRT_GE:
			// a >= b
			newBinGE(IntView<>(x), IntView<>(y, 1, c));
			break;
		case IRT_GT:
			// a > b <=> a >= (b+1)
			newBinGE(IntView<>(x), IntView<>(y, 1, 1 + c));
			break;
		default:
			NEVER;
	}

	vec<int> coeffs;
	vec<IntVar*> vars;

	coeffs.push(1);
	coeffs.push(-1);
	vars.push(x);
	vars.push(y);

	switch (t) {
		case IRT_EQ:
		case IRT_NE:
			break;
		case IRT_LE:
			mip->addConstraint(coeffs, vars, -1e100, c);
			break;
		case IRT_LT:
			mip->addConstraint(coeffs, vars, -1e100, c - 1);
			break;
		case IRT_GE:
			mip->addConstraint(coeffs, vars, c, 1e100);
			break;
		case IRT_GT:
			mip->addConstraint(coeffs, vars, c + 1, 1e100);
			break;
		default:
			NEVER;
	}
}